

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

void MIR_finish_func(MIR_context_t ctx)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  MIR_type_t MVar6;
  VARR_MIR_op_t *pVVar7;
  gen_ctx *pgVar8;
  MIR_item_t_conflict func_item;
  MIR_error_func_t p_Var9;
  bool bVar10;
  longdouble lVar11;
  bool bVar12;
  ushort uVar13;
  MIR_op_mode_t MVar14;
  uint uVar15;
  reg_desc_t *prVar16;
  c2mir_ctx *pcVar17;
  MIR_error_func_t p_Var18;
  long lVar19;
  MIR_func_t pMVar20;
  MIR_insn_t_conflict pMVar21;
  char *pcVar22;
  ulong extraout_RAX;
  bool bVar23;
  byte bVar24;
  int *in_RCX;
  MIR_insn_t pMVar25;
  undefined7 uVar26;
  uint7 uVar27;
  size_t nops;
  char *pcVar28;
  ulong uVar29;
  MIR_context_t pMVar30;
  MIR_insn_t_conflict in_RSI;
  char *pcVar31;
  MIR_op_mode_t mode;
  MIR_error_type_t MVar32;
  uint uVar33;
  ushort *unaff_R12;
  ulong unaff_R13;
  MIR_op_mode_t MVar34;
  int out_p;
  uint local_80;
  MIR_context_t local_78;
  char *local_70;
  uint local_64;
  ulong local_60;
  undefined1 local_48 [8];
  ushort uStack_40;
  
  pMVar20 = ctx->curr_func;
  if (pMVar20 == (MIR_func_t)0x0) {
    pcVar28 = "finish of non-existing function";
    MVar32 = MIR_no_func_error;
LAB_00132955:
    MVar14 = (*ctx->error_func)(MVar32,pcVar28);
    pMVar30 = ctx;
LAB_0013295a:
    p_Var18 = local_78->error_func;
    pcVar28 = insn_descs[unaff_R13 & 0xffffffff].name;
    pcVar22 = mode_str(MVar14);
    mode = 0x1a;
    (*p_Var18)(MIR_op_mode_error,
               "func %s: in instruction \'%s\': expected reg for operand #%d. Got \'%s\'",local_70,
               pcVar28,pMVar30,pcVar22);
LAB_0013299c:
    local_78->curr_func = (MIR_func_t)0x0;
    p_Var9 = local_78->error_func;
    pcVar28 = insn_descs[unaff_R13 & 0xffffffff].name;
    pcVar22 = mode_str(mode);
    pcVar31 = mode_str((MIR_op_mode_t)p_Var18);
    (*p_Var9)(MIR_op_mode_error,
              "func %s: in instruction \'%s\': unexpected operand mode for operand #%d. Got \'%s\', expected \'%s\'"
              ,local_70,pcVar28,pMVar30,pcVar22,pcVar31);
LAB_001329f6:
    pMVar30->curr_func = (MIR_func_t)0x0;
    (*pMVar30->error_func)
              (MIR_vararg_func_error,
               "func %s: in instruction \'%s\': number of operands in return does not correspond number of function returns. Expected %d, got %d"
               ,local_70,"ret",(ulong)_DAT_00000038,pcVar28);
LAB_00132a29:
    pMVar30->curr_func = (MIR_func_t)0x0;
    pcVar22 = "func %s: in insn \'%s\': function should not have results in this case";
    pcVar28 = "jret";
    MVar32 = MIR_vararg_func_error;
    ctx = pMVar30;
LAB_001327ab:
    (*ctx->error_func)(MVar32,pcVar22,local_70,pcVar28);
LAB_001327b5:
    __assert_fail("insn->ops[i].mode == MIR_OP_REF && insn->ops[i].u.ref->item_type == MIR_proto_item"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x647,"void MIR_finish_func(MIR_context_t)");
  }
  if (((pMVar20->vararg_p != '\0') || (pMVar20->nargs != 0)) || (local_80 = 1, pMVar20->nres != 1))
  {
    local_80 = 0;
  }
  pMVar21 = (pMVar20->insns).head;
  if (pMVar21 == (MIR_insn_t_conflict)0x0) {
    bVar12 = false;
    bVar10 = false;
  }
  else {
    local_70 = pMVar20->name;
    bVar10 = false;
    bVar12 = false;
    do {
      unaff_R13 = *(ulong *)&pMVar21->field_0x18;
      uVar15 = (uint)unaff_R13;
      if (uVar15 == 0xab) {
        bVar12 = true;
      }
      if (uVar15 == 0xac) {
        bVar10 = true;
      }
      local_78 = ctx;
      if (uVar15 - 0xb9 < 2) {
LAB_0013292a:
        ctx->curr_func = (MIR_func_t)0x0;
        pcVar28 = "use or phi can be used only internally";
LAB_00132950:
        MVar32 = MIR_vararg_func_error;
        goto LAB_00132955;
      }
      pMVar20 = ctx->curr_func;
      if ((uVar15 == 0xb2) && (pMVar20->vararg_p == '\0')) {
        ctx->curr_func = (MIR_func_t)0x0;
        pcVar28 = "va_start is not in vararg function";
        goto LAB_00132950;
      }
      if ((uVar15 == 0xac) && (pMVar30 = ctx, pMVar20->nres != 0)) goto LAB_00132a29;
      in_RSI = (MIR_insn_t_conflict)CONCAT71((int7)((ulong)in_RSI >> 8),uVar15 == 0xac);
      if ((uVar15 == 0xac && bVar12) || (uVar15 == 0xab && bVar10)) {
        ctx->curr_func = (MIR_func_t)0x0;
        (*ctx->error_func)(MIR_vararg_func_error,"func %s: mix of RET and JRET insns",local_70);
        goto LAB_0013292a;
      }
      pcVar28 = (char *)(unaff_R13 >> 0x20);
      if ((uVar15 == 0xab) && (pMVar30 = ctx, (uint32_t)(unaff_R13 >> 0x20) != pMVar20->nres))
      goto LAB_001329f6;
      uVar33 = uVar15 - 0xaa;
      in_RCX = (int *)0x0;
      if (uVar33 < 0xfffffffd) {
        pMVar25 = pMVar21;
        if (uVar15 - 0xa1 < 4) {
          do {
            pMVar25 = (pMVar25->insn_link).prev;
            if (pMVar25 == (MIR_insn_t)0x0) goto LAB_0013278c;
            uVar4 = *(uint *)&pMVar25->field_0x18;
            uVar29 = (ulong)uVar4;
          } while ((uVar29 == 0) && (*(char *)&pMVar25[1].insn_link.prev == '\x01'));
          if (uVar4 - 0x76 < 0xfffffff8) {
LAB_0013278c:
            pcVar28 = insn_descs[unaff_R13 & 0xffffffff].name;
            pcVar22 = 
            "func %s: instruction \'%s\' has no previous overflow insn separated only by stores and reg moves"
            ;
            MVar32 = MIR_invalid_insn_error;
            goto LAB_001327ab;
          }
          if ((((char)unaff_R13 == -0x5c) || ((uVar15 & 0xff) == 0xa2)) && ((uVar4 & 0x7e) == 0x72))
          {
            pcVar28 = insn_descs[uVar15 & 0xa6].name;
            pcVar22 = insn_descs[uVar29].name;
            pcVar31 = 
            "func %s: unsigned overflow branch \'%s\' consumes flag of signed overflow insn \'%s\'";
            goto LAB_00132b06;
          }
          if ((uVar15 & 0xa5) == 0xa1) {
            in_RCX = (int *)(ulong)local_80;
            if ((uVar4 & 0x7e) != 0x74) goto LAB_00132154;
            goto LAB_00132ab9;
          }
        }
        in_RCX = (int *)(ulong)local_80;
      }
LAB_00132154:
      local_80 = (uint)in_RCX;
      if (pcVar28 != (char *)0x0) {
        puVar1 = &pMVar21->ops[0].field_0x8;
        pMVar30 = (MIR_context_t)&DAT_00000001;
        unaff_R12 = (ushort *)puVar1;
        do {
          uVar26 = (undefined7)((ulong)in_RCX >> 8);
          bVar23 = pMVar30 != (MIR_context_t)&DAT_00000001 || uVar15 != 0xb5;
          in_RCX = (int *)CONCAT71(uVar26,bVar23);
          if (bVar23) {
            if (uVar33 < 0xfffffffd) {
LAB_001321ed:
              bVar23 = pMVar30 != (MIR_context_t)0x3 || uVar15 != 0xb0;
              in_RCX = (int *)CONCAT71(uVar26,bVar23);
              if (bVar23) {
                if (uVar15 == 0xaa) {
                  _local_48 = (longdouble)((unkuint10)stack0xffffffffffffffbc << 0x20);
                  p_Var18 = (MIR_error_func_t)
                            ((ulong)(pMVar30 != (MIR_context_t)&DAT_00000001) * 9 + 3);
                }
                else if (uVar15 == 0xab) {
                  _local_48 = (longdouble)((unkuint10)stack0xffffffffffffffbc << 0x20);
                  MVar6 = ctx->curr_func->res_types[(long)((long)&pMVar30[-1].wrapper_end_addr + 7)]
                  ;
                  if (MVar6 == MIR_T_F) {
                    p_Var18 = (MIR_error_func_t)0x5;
                  }
                  else if (MVar6 == MIR_T_D) {
                    p_Var18 = (MIR_error_func_t)0x6;
                  }
                  else {
                    p_Var18 = (MIR_error_func_t)0x0;
                    if (MVar6 != MIR_T_UNDEF) {
                      in_RCX = (int *)0x0;
                      p_Var18 = (MIR_error_func_t)(ulong)((uint)(MVar6 == MIR_T_LD) * 4 + 3);
                    }
                  }
                }
                else {
                  in_RCX = (int *)local_48;
                  in_RSI = pMVar21;
                  MVar14 = MIR_insn_op_mode(ctx,pMVar21,
                                            (size_t)((long)&pMVar30[-1].wrapper_end_addr + 7),in_RCX
                                           );
                  p_Var18 = (MIR_error_func_t)(ulong)MVar14;
                }
                uVar13 = (ushort)(byte)*unaff_R12;
                if (uVar13 < 10) {
                  if (uVar13 == 1) {
                    in_RSI = (MIR_insn_t_conflict)(ulong)*(uint *)(unaff_R12 + 4);
                    prVar16 = find_rd_by_reg(ctx,*(uint *)(unaff_R12 + 4),ctx->curr_func);
                    if ((prVar16 == (reg_desc_t *)0x0) ||
                       (*(MIR_reg_t *)(unaff_R12 + 4) != prVar16->reg)) {
                      __assert_fail("rd != ((void*)0) && insn->ops[i].u.reg == rd->reg",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                    ,0x662,"void MIR_finish_func(MIR_context_t)");
                    }
                    MVar6 = prVar16->type;
                    uVar27 = (uint7)(uint3)(*(MIR_reg_t *)(unaff_R12 + 4) >> 8);
                    bVar24 = 1;
                    if (MVar6 == MIR_T_F) {
LAB_001324a9:
                      bVar24 = 1;
                      mode = MIR_OP_FLOAT;
                    }
                    else if (MVar6 == MIR_T_D) {
LAB_001324a2:
                      bVar24 = 1;
                      mode = MIR_OP_DOUBLE;
                    }
                    else {
                      mode = MIR_OP_UNDEF;
                      if (MVar6 == MIR_T_UNDEF) goto LAB_001324be;
                      bVar23 = MVar6 == MIR_T_LD;
LAB_001324b4:
                      bVar24 = 1;
                      mode = (uint)bVar23 * 4 + MIR_OP_INT;
                    }
                  }
                  else {
                    if (uVar13 == 2) goto LAB_0013288d;
LAB_0013248a:
                    if ((uVar13 & 0xfffe) == 8) {
                      uVar13 = 3;
                    }
                    mode = (MIR_op_mode_t)uVar13;
                    bVar24 = 0;
                    uVar27 = 0;
                  }
LAB_001324be:
                  bVar3 = (byte)*unaff_R12;
                  MVar14 = (MIR_op_mode_t)bVar3;
                  *unaff_R12 = (ushort)(mode << 8) | (ushort)bVar3;
                  MVar34 = (MIR_op_mode_t)p_Var18;
                  if ((mode == MIR_OP_UNDEF) && (bVar3 == 10)) {
                    in_RSI = (MIR_insn_t_conflict)
                             CONCAT71((int7)((ulong)in_RSI >> 8),
                                      pMVar30 == (MIR_context_t)&DAT_00000001);
                    if ((uVar15 != 0xb2 || pMVar30 != (MIR_context_t)&DAT_00000001) &&
                       (pMVar30 != (MIR_context_t)&DAT_00000002 ||
                        uVar15 != 0xb3 && (uVar15 & 0xfffffffe) != 0xb0)) goto LAB_001324fe;
                    *unaff_R12 = (ushort)(MVar34 << 8) | 10;
                  }
                  else {
LAB_001324fe:
                    if ((char)p_Var18 != '\0') {
                      if ((MVar34 & 0xff) == MIR_OP_REG) {
                        if (1 < (ushort)(bVar3 - 1)) goto LAB_0013295a;
                      }
                      else {
                        MVar14 = mode;
                        if (mode == MIR_OP_UINT) {
                          MVar14 = MIR_OP_INT;
                        }
                        if (MVar14 != MVar34) goto LAB_0013299c;
                      }
                    }
                  }
                  bVar24 = bVar24 | local_48._0_4_ == 0;
                  in_RCX = (int *)CONCAT71(uVar27,bVar24);
                  if (bVar24 != 0) goto LAB_00132551;
                  ctx->curr_func = (MIR_func_t)0x0;
                  pcVar28 = insn_descs[unaff_R13 & 0xffffffff].name;
                  pcVar22 = "func %s; in instruction \'%s\': wrong operand #%d for insn output";
                  MVar32 = MIR_out_op_error;
                }
                else {
                  if (uVar13 != 10) {
                    if (uVar13 == 0xb) goto LAB_0013288d;
                    goto LAB_0013248a;
                  }
                  bVar3 = (byte)unaff_R12[4];
                  if ((0xb < bVar3) &&
                     ((uVar33 < 0xfffffffd ||
                      (in_RCX = (int *)(ulong)(bVar3 - 0x12), bVar3 - 0x12 < 0xfffffffa)))) {
                    ctx->curr_func = (MIR_func_t)0x0;
                    pcVar28 = insn_descs[unaff_R13 & 0xffffffff].name;
                    pcVar22 = "func %s: in instruction \'%s\': wrong type memory";
LAB_00132aa2:
                    (*ctx->error_func)(MIR_wrong_type_error,pcVar22,local_70,pcVar28);
                    goto LAB_00132ab2;
                  }
                  if ((0xfffffff9 < bVar3 - 0x12) && (*(long *)(unaff_R12 + 0x10) < 0)) {
                    ctx->curr_func = (MIR_func_t)0x0;
                    pcVar28 = insn_descs[unaff_R13 & 0xffffffff].name;
                    pcVar22 = "func %s: in instruction \'%s\': block type memory with disp < 0";
                    goto LAB_00132aa2;
                  }
                  if (*(MIR_reg_t *)(unaff_R12 + 0xc) == 0) {
LAB_00132404:
                    uVar4 = *(uint *)(unaff_R12 + 0xe);
                    in_RSI = (MIR_insn_t_conflict)(ulong)uVar4;
                    if (uVar4 != 0) {
                      prVar16 = find_rd_by_reg(ctx,uVar4,ctx->curr_func);
                      if ((prVar16 == (reg_desc_t *)0x0) ||
                         (in_RCX = (int *)(ulong)*(uint *)(unaff_R12 + 0xe),
                         *(uint *)(unaff_R12 + 0xe) != prVar16->reg)) {
                        __assert_fail("rd != ((void*)0) && insn->ops[i].u.mem.index == rd->reg",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                      ,0x682,"void MIR_finish_func(MIR_context_t)");
                      }
                      if ((prVar16->type < MIR_T_BOUND) &&
                         (in_RCX = (int *)0x40700, (0x40700U >> (prVar16->type & 0x1f) & 1) != 0)) {
                        ctx->curr_func = (MIR_func_t)0x0;
                        pcVar28 = insn_descs[unaff_R13 & 0xffffffff].name;
                        pcVar22 = 
                        "func %s: in instruction \'%s\': index reg of non-integer type for operand #%d"
                        ;
                        goto LAB_0013287a;
                      }
                    }
                    bVar3 = (byte)unaff_R12[4];
                    local_80 = 0;
                    uVar27 = (uint7)((ulong)in_RCX >> 8);
                    bVar24 = 1;
                    if (bVar3 == 8) goto LAB_001324a9;
                    if (bVar3 == 9) goto LAB_001324a2;
                    if (bVar3 != 0x12) {
                      bVar23 = bVar3 == 10;
                      goto LAB_001324b4;
                    }
                    mode = MIR_OP_UNDEF;
                    goto LAB_001324be;
                  }
                  prVar16 = find_rd_by_reg(ctx,*(MIR_reg_t *)(unaff_R12 + 0xc),ctx->curr_func);
                  if ((prVar16 == (reg_desc_t *)0x0) ||
                     (in_RCX = (int *)(ulong)*(uint *)(unaff_R12 + 0xc),
                     *(uint *)(unaff_R12 + 0xc) != prVar16->reg)) {
                    __assert_fail("rd != ((void*)0) && insn->ops[i].u.mem.base == rd->reg",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                  ,0x676,"void MIR_finish_func(MIR_context_t)");
                  }
                  if ((MIR_T_UNDEF < prVar16->type) ||
                     (in_RCX = (int *)0x40700, (0x40700U >> (prVar16->type & 0x1f) & 1) == 0))
                  goto LAB_00132404;
                  ctx->curr_func = (MIR_func_t)0x0;
                  pcVar28 = insn_descs[unaff_R13 & 0xffffffff].name;
                  pcVar22 = 
                  "func %s: in instruction \'%s\': base reg of non-integer type for operand #%d";
LAB_0013287a:
                  MVar32 = MIR_reg_type_error;
                }
                (*ctx->error_func)(MVar32,pcVar22,local_70,pcVar28,pMVar30);
LAB_0013288d:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                              ,0x692,"void MIR_finish_func(MIR_context_t)");
              }
              if (*(char *)((long)&pMVar21[1].ops[0].u + 8) != '\n') {
                __assert_fail("insn->ops[i].mode == MIR_OP_MEM",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                              ,0x652,"void MIR_finish_func(MIR_context_t)");
              }
            }
            else if (pMVar30 == (MIR_context_t)&DAT_00000001) {
              if ((pMVar21->ops[0].field_0x8 != '\b') ||
                 ((pMVar21->ops[0].u.ref)->item_type != MIR_proto_item)) goto LAB_001327b5;
            }
            else {
              if ((pMVar30 != (MIR_context_t)&DAT_00000002) ||
                 (*(char *)&pMVar21[1].insn_link.prev != '\b')) goto LAB_001321ed;
              iVar5 = *(int *)&(pMVar21[1].insn_link.next)->ops[0].data;
              uVar4 = iVar5 - 2;
              in_RCX = (int *)(ulong)uVar4;
              if ((2 < uVar4) && (iVar5 != 0)) goto LAB_00132b15;
            }
          }
          else if (*puVar1 != '\x03') {
            __assert_fail("insn->ops[i].mode == MIR_OP_INT",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                          ,0x642,"void MIR_finish_func(MIR_context_t)");
          }
LAB_00132551:
          unaff_R12 = unaff_R12 + 0x18;
          puVar2 = (undefined1 *)((1 - (long)pcVar28) + (long)pMVar30);
          pMVar30 = (MIR_context_t)((long)&pMVar30->gen_ctx + 1);
        } while (puVar2 != (undefined1 *)0x1);
      }
      pMVar21 = (pMVar21->insn_link).next;
    } while (pMVar21 != (MIR_insn_t)0x0);
  }
  local_60 = CONCAT71((int7)((ulong)in_RCX >> 8),bVar10 | bVar12);
  if (((bVar10 | bVar12) == 0) &&
     ((pMVar21 = (ctx->curr_func->insns).tail, pMVar21 == (MIR_insn_t_conflict)0x0 ||
      (*(int *)&pMVar21->field_0x18 != 0x76)))) {
    pVVar7 = ctx->temp_ops;
    if ((pVVar7 == (VARR_MIR_op_t *)0x0) || (pVVar7->varr == (MIR_op_t *)0x0)) {
      MIR_finish_func_cold_3();
    }
    else {
      pVVar7->els_num = 0;
      pMVar20 = ctx->curr_func;
      nops = (size_t)pMVar20->nres;
      if (nops != 0) {
        uVar29 = 0;
        local_64 = (uint)local_60;
        local_60 = local_60 & 0xffffffff;
        do {
          MVar6 = pMVar20->res_types[uVar29];
          if (MVar6 == MIR_T_LD) {
            unaff_R13 = 7;
            _local_48 = (longdouble)0;
          }
          else if (MVar6 == MIR_T_D) {
            uVar15 = (uint)unaff_R12 & 0xffffff00 | 6;
            unaff_R12 = (ushort *)(ulong)uVar15;
            _local_48 = (longdouble)((unkuint10)uStack_40 << 0x40);
            unaff_R13 = (ulong)uVar15;
          }
          else {
            if (MVar6 == MIR_T_F) {
              uVar15 = local_64 & 0xffffff00 | 5;
              _local_48 = (longdouble)((unkuint10)stack0xffffffffffffffbc << 0x20);
              local_64 = uVar15;
            }
            else {
              uVar15 = (uint)local_60 & 0xffffff00 | 3;
              _local_48 = (longdouble)((unkuint10)uStack_40 << 0x40);
              local_60 = local_60 & 0xffffffffffffff00;
            }
            unaff_R13 = (ulong)uVar15;
          }
          lVar11 = _local_48;
          pMVar30 = (MIR_context_t)ctx->temp_ops;
          if (pMVar30->error_func == (MIR_error_func_t)0x0) {
LAB_00132ab2:
            MIR_finish_func_cold_1();
            uVar29 = extraout_RAX;
            ctx = pMVar30;
LAB_00132ab9:
            pcVar28 = insn_descs[unaff_R13 & 0xffffffff].name;
            pcVar22 = insn_descs[uVar29].name;
            pcVar31 = 
            "func %s: signed overflow branch \'%s\' consumes flag of unsigned overflow insn \'%s\'";
LAB_00132b06:
            (*ctx->error_func)(MIR_invalid_insn_error,pcVar31,local_70,pcVar28,pcVar22);
LAB_00132b15:
            __assert_fail("insn->ops[i].u.ref->item_type == MIR_import_item || insn->ops[i].u.ref->item_type == MIR_export_item || insn->ops[i].u.ref->item_type == MIR_forward_item || insn->ops[i].u.ref->item_type == MIR_func_item"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                          ,0x64d,"void MIR_finish_func(MIR_context_t)");
          }
          pcVar17 = (c2mir_ctx *)((long)&pMVar30->gen_ctx->ctx + 1);
          if (pMVar30->c2mir_ctx < pcVar17) {
            in_RSI = (MIR_insn_t_conflict)((long)(pcVar17 + ((ulong)pcVar17 >> 1)) * 0x30);
            p_Var18 = (MIR_error_func_t)realloc(pMVar30->error_func,(size_t)in_RSI);
            pMVar30->error_func = p_Var18;
            pMVar30->c2mir_ctx = pcVar17 + ((ulong)pcVar17 >> 1);
          }
          pgVar8 = pMVar30->gen_ctx;
          p_Var18 = pMVar30->error_func;
          pMVar30->gen_ctx = (gen_ctx *)((long)&pgVar8->ctx + 1);
          lVar19 = (long)pgVar8 * 0x30;
          *(undefined8 *)(p_Var18 + lVar19) = 0;
          *(short *)(p_Var18 + lVar19 + 8) = (short)unaff_R13;
          *(longdouble *)(p_Var18 + lVar19 + 0x10) = lVar11;
          uVar29 = uVar29 + 1;
          pMVar20 = ctx->curr_func;
          nops = (size_t)pMVar20->nres;
        } while (uVar29 < nops);
      }
      if (ctx->temp_ops != (VARR_MIR_op_t *)0x0) {
        func_item = pMVar20->func_item;
        pMVar21 = MIR_new_insn_arr(ctx,MIR_RET,nops,ctx->temp_ops->varr);
        MIR_append_insn(ctx,func_item,pMVar21);
        goto LAB_00132741;
      }
    }
    MIR_finish_func_cold_2();
    if (in_RSI == (MIR_insn_t_conflict)0x0) {
      __assert_fail("insn != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0x816,"size_t MIR_insn_nops(MIR_context_t, MIR_insn_t)");
    }
    return;
  }
LAB_00132741:
  pMVar20 = ctx->curr_func;
  pMVar20->expr_p = (char)local_80;
  pMVar20->jret_p = bVar10;
  ctx->curr_func = (MIR_func_t)0x0;
  return;
}

Assistant:

void MIR_finish_func (MIR_context_t ctx) {
  int expr_p = TRUE;
  MIR_insn_t insn, prev_insn;
  MIR_insn_code_t code;
  const char *func_name;
  int ret_p = FALSE, jret_p = FALSE;

  if (curr_func == NULL)
    MIR_get_error_func (ctx) (MIR_no_func_error, "finish of non-existing function");
  func_name = curr_func->name;
  if (curr_func->vararg_p || curr_func->nargs != 0 || curr_func->nres != 1) expr_p = FALSE;
  for (insn = DLIST_HEAD (MIR_insn_t, curr_func->insns); insn != NULL;
       insn = DLIST_NEXT (MIR_insn_t, insn)) {
    size_t i, actual_nops = MIR_insn_nops (ctx, insn);
    MIR_op_mode_t mode, expected_mode;
    reg_desc_t *rd;
    int out_p, can_be_out_p;

    code = insn->code;
    if (code == MIR_RET) ret_p = TRUE;
    if (code == MIR_JRET) jret_p = TRUE;
    if (code == MIR_PHI || code == MIR_USE) {
      curr_func = NULL;
      MIR_get_error_func (ctx) (MIR_vararg_func_error, "use or phi can be used only internally");
    } else if (!curr_func->vararg_p && code == MIR_VA_START) {
      curr_func = NULL;
      MIR_get_error_func (ctx) (MIR_vararg_func_error, "va_start is not in vararg function");
    } else if (code == MIR_JRET && curr_func->nres != 0) {
      curr_func = NULL;
      MIR_get_error_func (
        ctx) (MIR_vararg_func_error,
              "func %s: in insn '%s': function should not have results in this case", func_name,
              insn_descs[code].name);
    } else if ((code == MIR_JRET && ret_p) || (code == MIR_RET && jret_p)) {
      curr_func = NULL;
      MIR_get_error_func (ctx) (MIR_vararg_func_error, "func %s: mix of RET and JRET insns",
                                func_name);
    } else if (code == MIR_RET && actual_nops != curr_func->nres) {
      curr_func = NULL;
      MIR_get_error_func (
        ctx) (MIR_vararg_func_error,
              "func %s: in instruction '%s': number of operands in return does not "
              "correspond number of function returns. Expected %d, got %d",
              func_name, insn_descs[code].name, curr_func->nres, actual_nops);
    } else if (MIR_call_code_p (code)) {
      expr_p = FALSE;
    } else if (code == MIR_BO || code == MIR_UBO || code == MIR_BNO || code == MIR_UBNO) {
      for (prev_insn = DLIST_PREV (MIR_insn_t, insn); prev_insn != NULL;
           prev_insn = DLIST_PREV (MIR_insn_t, prev_insn))
        if (prev_insn->code != MIR_MOV || prev_insn->ops[1].mode != MIR_OP_REG) break;
      if (prev_insn == NULL || !MIR_overflow_insn_code_p (prev_insn->code))
        MIR_get_error_func (ctx) (MIR_invalid_insn_error,
                                  "func %s: instruction '%s' has no previous overflow insn "
                                  "separated only by stores and reg moves",
                                  func_name, insn_descs[code].name);
      else if ((code == MIR_UBO || code == MIR_UBNO)
               && (prev_insn->code == MIR_MULO || prev_insn->code == MIR_MULOS))
        MIR_get_error_func (
          ctx) (MIR_invalid_insn_error,
                "func %s: unsigned overflow branch '%s' consumes flag of signed overflow insn '%s'",
                func_name, insn_descs[code].name, insn_descs[prev_insn->code].name);
      else if ((code == MIR_BO || code == MIR_BNO)
               && (prev_insn->code == MIR_UMULO || prev_insn->code == MIR_UMULOS))
        MIR_get_error_func (
          ctx) (MIR_invalid_insn_error,
                "func %s: signed overflow branch '%s' consumes flag of unsigned overflow insn '%s'",
                func_name, insn_descs[code].name, insn_descs[prev_insn->code].name);
    }
    for (i = 0; i < actual_nops; i++) {
      if (code == MIR_UNSPEC && i == 0) {
        mir_assert (insn->ops[i].mode == MIR_OP_INT);
        continue;
      } else if (MIR_call_code_p (code)) {
        if (i == 0) {
          mir_assert (insn->ops[i].mode == MIR_OP_REF
                      && insn->ops[i].u.ref->item_type == MIR_proto_item);
          continue; /* We checked the operand during insn creation -- skip the prototype */
        } else if (i == 1 && insn->ops[i].mode == MIR_OP_REF) {
          mir_assert (insn->ops[i].u.ref->item_type == MIR_import_item
                      || insn->ops[i].u.ref->item_type == MIR_export_item
                      || insn->ops[i].u.ref->item_type == MIR_forward_item
                      || insn->ops[i].u.ref->item_type == MIR_func_item);
          continue; /* We checked the operand during insn creation -- skip the func */
        }
      }
      if (code == MIR_VA_ARG && i == 2) {
        mir_assert (insn->ops[i].mode == MIR_OP_MEM);
        continue; /* We checked the operand during insn creation -- skip va_arg type  */
      }
      if (code == MIR_SWITCH) {
        out_p = FALSE;
        expected_mode = i == 0 ? MIR_OP_INT : MIR_OP_LABEL;
      } else if (code == MIR_RET) {
        out_p = FALSE;
        expected_mode = type2mode (curr_func->res_types[i]);
      } else {
        expected_mode = MIR_insn_op_mode (ctx, insn, i, &out_p);
      }
      can_be_out_p = TRUE;
      switch (insn->ops[i].mode) {
      case MIR_OP_REG:
        rd = find_rd_by_reg (ctx, insn->ops[i].u.reg, curr_func);
        mir_assert (rd != NULL && insn->ops[i].u.reg == rd->reg);
        mode = type2mode (rd->type);
        break;
      case MIR_OP_MEM:
        expr_p = FALSE;
        if (wrong_type_p (insn->ops[i].u.mem.type)
            && (!MIR_all_blk_type_p (insn->ops[i].u.mem.type) || !MIR_call_code_p (code))) {
          curr_func = NULL;
          MIR_get_error_func (ctx) (MIR_wrong_type_error,
                                    "func %s: in instruction '%s': wrong type memory", func_name,
                                    insn_descs[code].name);
        }
        if (MIR_all_blk_type_p (insn->ops[i].u.mem.type) && insn->ops[i].u.mem.disp < 0) {
          curr_func = NULL;
          MIR_get_error_func (ctx) (MIR_wrong_type_error,
                                    "func %s: in instruction '%s': block type memory with disp < 0",
                                    func_name, insn_descs[code].name);
        }
        if (insn->ops[i].u.mem.base != 0) {
          rd = find_rd_by_reg (ctx, insn->ops[i].u.mem.base, curr_func);
          mir_assert (rd != NULL && insn->ops[i].u.mem.base == rd->reg);
          if (type2mode (rd->type) != MIR_OP_INT) {
            curr_func = NULL;
            MIR_get_error_func (
              ctx) (MIR_reg_type_error,
                    "func %s: in instruction '%s': base reg of non-integer type for operand "
                    "#%d",
                    func_name, insn_descs[code].name, i + 1);
          }
        }
        if (insn->ops[i].u.mem.index != 0) {
          rd = find_rd_by_reg (ctx, insn->ops[i].u.mem.index, curr_func);
          mir_assert (rd != NULL && insn->ops[i].u.mem.index == rd->reg);
          if (type2mode (rd->type) != MIR_OP_INT) {
            curr_func = NULL;
            MIR_get_error_func (
              ctx) (MIR_reg_type_error,
                    "func %s: in instruction '%s': index reg of non-integer type for "
                    "operand #%d",
                    func_name, insn_descs[code].name, i + 1);
          }
        }
        mode = type2mode (insn->ops[i].u.mem.type);
        break;
      case MIR_OP_VAR:
      case MIR_OP_VAR_MEM:
        expr_p = FALSE;
        mode = expected_mode;
        mir_assert (FALSE); /* Should not be here */
        break;
      default:
        can_be_out_p = FALSE;
        mode = insn->ops[i].mode;
        if (mode == MIR_OP_REF || mode == MIR_OP_STR) mode = MIR_OP_INT; /* just an address */
        break;
      }
      insn->ops[i].value_mode = mode;
      if (mode == MIR_OP_UNDEF && insn->ops[i].mode == MIR_OP_MEM
          && ((code == MIR_VA_START && i == 0)
              || ((code == MIR_VA_ARG || code == MIR_VA_BLOCK_ARG) && i == 1)
              || (code == MIR_VA_END && i == 1))) { /* a special case: va_list as undef type mem */
        insn->ops[i].value_mode = expected_mode;
      } else if (expected_mode == MIR_OP_REG) {
        if (insn->ops[i].mode != MIR_OP_REG && insn->ops[i].mode != MIR_OP_VAR)
          MIR_get_error_func (
            ctx) (MIR_op_mode_error,
                  "func %s: in instruction '%s': expected reg for operand #%d. Got '%s'", func_name,
                  insn_descs[code].name, i + 1, mode_str (insn->ops[i].mode));
      } else if (expected_mode != MIR_OP_UNDEF
                 && (mode == MIR_OP_UINT ? MIR_OP_INT : mode) != expected_mode) {
        curr_func = NULL;
        MIR_get_error_func (
          ctx) (MIR_op_mode_error,
                "func %s: in instruction '%s': unexpected operand mode for operand #%d. Got "
                "'%s', expected '%s'",
                func_name, insn_descs[code].name, i + 1, mode_str (mode), mode_str (expected_mode));
      }
      if (out_p && !can_be_out_p) {
        curr_func = NULL;
        MIR_get_error_func (ctx) (MIR_out_op_error,
                                  "func %s; in instruction '%s': wrong operand #%d for insn output",
                                  func_name, insn_descs[code].name, i + 1);
      }
    }
  }
  if (!ret_p && !jret_p
      && ((insn = DLIST_TAIL (MIR_insn_t, curr_func->insns)) == NULL || insn->code != MIR_JMP)) {
    VARR_TRUNC (MIR_op_t, temp_ops, 0);
    for (size_t i = 0; i < curr_func->nres; i++) { /* add absent ret */
      MIR_op_t op;
      if (curr_func->res_types[i] == MIR_T_F)
        op = MIR_new_float_op (ctx, 0.0f);
      else if (curr_func->res_types[i] == MIR_T_D)
        op = MIR_new_double_op (ctx, 0.0);
      else if (curr_func->res_types[i] == MIR_T_LD)
        op = MIR_new_ldouble_op (ctx, 0.0);
      else
        op = MIR_new_int_op (ctx, 0);
      VARR_PUSH (MIR_op_t, temp_ops, op);
    }
    MIR_append_insn (ctx, curr_func->func_item,
                     MIR_new_insn_arr (ctx, MIR_RET, curr_func->nres,
                                       VARR_ADDR (MIR_op_t, temp_ops)));
  }
  curr_func->expr_p = expr_p;
  curr_func->jret_p = jret_p;
  curr_func = NULL;
}